

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOGetTypedIntArray(FmsIOContext *ctx,char *path,FmsIntType *type,void **values,FmsInt *n)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulonglong uVar4;
  int *piVar5;
  intmax_t iVar6;
  void *pvVar7;
  size_t sVar8;
  uintmax_t uVar9;
  ulong uVar10;
  ulong uVar11;
  char *newoff;
  ulong local_448;
  size_t *local_440;
  char v [512];
  char k [512];
  
  if (ctx == (FmsIOContext *)0x0) {
    iVar1 = 1;
  }
  else if (path == (char *)0x0) {
    iVar1 = 2;
  }
  else if (type == (FmsIntType *)0x0) {
    iVar1 = 3;
  }
  else if (values == (void **)0x0) {
    iVar1 = 4;
  }
  else if (n == (FmsInt *)0x0) {
    iVar1 = 5;
  }
  else {
    iVar1 = FmsIOReadKeyValue(ctx,k,v);
    if (iVar1 == 0) {
      local_440 = n;
      pcVar3 = join_keys(path,"Size");
      iVar1 = strcmp(k,pcVar3);
      free(pcVar3);
      if (iVar1 == 0) {
        iVar1 = 10;
        uVar4 = strtoull(v,(char **)0x0,10);
        *local_440 = uVar4;
        piVar5 = __errno_location();
        if (*piVar5 == 0x22) {
          iVar1 = 8;
        }
        else if (*piVar5 == 0x16) {
          iVar1 = 9;
        }
        else {
          iVar2 = FmsIOReadKeyValue(ctx,k,v);
          if (iVar2 == 0) {
            pcVar3 = join_keys(path,"Type");
            iVar1 = strcmp(k,pcVar3);
            free(pcVar3);
            if (iVar1 == 0) {
              iVar1 = FmsGetIntTypeFromName(v,type);
              if (iVar1 == 0) {
                if (*local_440 != 0) {
                  iVar1 = FmsIOReadKeyValue(ctx,k,v);
                  if (iVar1 != 0) {
                    return 0xe;
                  }
                  pcVar3 = join_keys(path,"Values");
                  iVar1 = strcmp(k,pcVar3);
                  free(pcVar3);
                  if (iVar1 != 0) {
                    return 0xf;
                  }
                  switch(*type) {
                  case FMS_INT8:
                    pvVar7 = malloc(*local_440);
                    local_448 = 0;
                    do {
                      uVar10 = local_448;
                      sVar8 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar11 = local_448;
                        if ((sVar8 == 0) || (uVar11 = uVar10, *local_440 <= uVar10)) break;
                        iVar6 = strtoimax(pcVar3,&newoff,10);
                        *(char *)((long)pvVar7 + uVar10) = (char)iVar6;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar10 = uVar10 + 1;
                        uVar11 = uVar10;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar8);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar11, iVar1 == 0));
                    break;
                  case FMS_INT16:
                    pvVar7 = malloc(*local_440 * 2);
                    local_448 = 0;
                    do {
                      uVar10 = local_448;
                      sVar8 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar11 = local_448;
                        if ((sVar8 == 0) || (uVar11 = uVar10, *local_440 <= uVar10)) break;
                        iVar6 = strtoimax(pcVar3,&newoff,10);
                        *(short *)((long)pvVar7 + uVar10 * 2) = (short)iVar6;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar10 = uVar10 + 1;
                        uVar11 = uVar10;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar8);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar11, iVar1 == 0));
                    break;
                  case FMS_INT32:
                    pvVar7 = malloc(*local_440 << 2);
                    local_448 = 0;
                    do {
                      uVar10 = local_448;
                      sVar8 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar11 = local_448;
                        if ((sVar8 == 0) || (uVar11 = uVar10, *local_440 <= uVar10)) break;
                        iVar6 = strtoimax(pcVar3,&newoff,10);
                        *(int *)((long)pvVar7 + uVar10 * 4) = (int)iVar6;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar10 = uVar10 + 1;
                        uVar11 = uVar10;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar8);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar11, iVar1 == 0));
                    break;
                  case FMS_INT64:
                    pvVar7 = malloc(*local_440 << 3);
                    local_448 = 0;
                    do {
                      uVar10 = local_448;
                      sVar8 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar11 = local_448;
                        if ((sVar8 == 0) || (uVar11 = uVar10, *local_440 <= uVar10)) break;
                        iVar6 = strtoimax(pcVar3,&newoff,10);
                        *(intmax_t *)((long)pvVar7 + uVar10 * 8) = iVar6;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar10 = uVar10 + 1;
                        uVar11 = uVar10;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar8);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar11, iVar1 == 0));
                    break;
                  case FMS_ORIENTATION_INT_TYPE:
                    pvVar7 = malloc(*local_440);
                    local_448 = 0;
                    do {
                      uVar10 = local_448;
                      sVar8 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar11 = local_448;
                        if ((sVar8 == 0) || (uVar11 = uVar10, *local_440 <= uVar10)) break;
                        uVar9 = strtoumax(pcVar3,&newoff,10);
                        *(char *)((long)pvVar7 + uVar10) = (char)uVar9;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar10 = uVar10 + 1;
                        uVar11 = uVar10;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar8);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar11, iVar1 == 0));
                    break;
                  case FMS_UINT16:
                    pvVar7 = malloc(*local_440 * 2);
                    local_448 = 0;
                    do {
                      uVar10 = local_448;
                      sVar8 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar11 = local_448;
                        if ((sVar8 == 0) || (uVar11 = uVar10, *local_440 <= uVar10)) break;
                        uVar9 = strtoumax(pcVar3,&newoff,10);
                        *(short *)((long)pvVar7 + uVar10 * 2) = (short)uVar9;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar10 = uVar10 + 1;
                        uVar11 = uVar10;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar8);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar11, iVar1 == 0));
                    break;
                  case FMS_UINT32:
                    pvVar7 = malloc(*local_440 << 2);
                    local_448 = 0;
                    do {
                      uVar10 = local_448;
                      sVar8 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar11 = local_448;
                        if ((sVar8 == 0) || (uVar11 = uVar10, *local_440 <= uVar10)) break;
                        uVar9 = strtoumax(pcVar3,&newoff,10);
                        *(int *)((long)pvVar7 + uVar10 * 4) = (int)uVar9;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar10 = uVar10 + 1;
                        uVar11 = uVar10;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar8);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar11, iVar1 == 0));
                    break;
                  case FMS_INT_TYPE:
                    pvVar7 = malloc(*local_440 << 3);
                    local_448 = 0;
                    do {
                      uVar10 = local_448;
                      sVar8 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar11 = local_448;
                        if ((sVar8 == 0) || (uVar11 = uVar10, *local_440 <= uVar10)) break;
                        uVar9 = strtoumax(pcVar3,&newoff,10);
                        *(uintmax_t *)((long)pvVar7 + uVar10 * 8) = uVar9;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar10 = uVar10 + 1;
                        uVar11 = uVar10;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar8);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar11, iVar1 == 0));
                    break;
                  default:
                    return 0x10;
                  }
                  *values = pvVar7;
                }
                iVar1 = 0;
              }
              else {
                iVar1 = 0xc;
              }
            }
            else {
              iVar1 = 0xb;
            }
          }
        }
      }
      else {
        iVar1 = 7;
      }
    }
    else {
      iVar1 = 6;
    }
  }
  return iVar1;
}

Assistant:

static int
FmsIOGetTypedIntArray(FmsIOContext *ctx, const char *path, FmsIntType *type,
                      void **values, FmsInt *n) {
  int err = 0;
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!type) E_RETURN(3);
  if(!values) E_RETURN(4);
  if(!n) E_RETURN(5);

  /* Arrays are written like:
      path/Size: n
      path/Type: type
      path/Values: [1,2,3,
      4,5,6
      7,8,9]
  */

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(6);

    char *ksize = join_keys(path, "Size");
    err = strcmp(k, ksize);
    FREE(ksize);
    // Path & key didn't match
    if(err)
      E_RETURN(7);

    *n = StrToFmsInt(v, NULL, 10);

    if (errno == ERANGE) { E_RETURN(8); }
    if (errno == EINVAL) { E_RETURN(9); }
  }

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(10);

    char *ktype= join_keys(path, "Type");
    err = strcmp(k, ktype);
    FREE(ktype);
    // Path & key didn't match
    if(err)
      E_RETURN(11);

    if(FmsGetIntTypeFromName(v, type))
      E_RETURN(12);
  }

  // Values does not get written if Size == 0
  if(*n == 0)
    return 0;

  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(14);

  char *kvalues = join_keys(path, "Values");
  err = strcmp(k, kvalues);
  FREE(kvalues);
  if(err)
    E_RETURN(15);

#define READ_ARRAY_DATA(DEST_T, FUNC) \
do { \
    DEST_T *data = malloc(sizeof(DEST_T) * *n); \
    FmsInt i = 0; \
    while(1) { \
        size_t len = strlen(v); \
        char *off = v, *newoff = NULL; \
        if(off[0] == '[') \
            off++; \
        while(len && i < *n) { \
            data[i++] = (DEST_T)FUNC(off, &newoff, 10); \
            newoff++; \
            if(*newoff == ' ') newoff++; /* Current flaw in the file format, last element has no trialing space */ \
            if(newoff >= v + len) break; \
            off = newoff; \
        }